

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.h
# Opt level: O3

void __thiscall Population::initialize(Population *this)

{
  pointer ppEVar1;
  pointer ppEVar2;
  Clock *pCVar3;
  Logging *pLVar4;
  allocator_type local_39;
  vector<Event_*,_std::allocator<Event_*>_> local_38;
  value_type local_20;
  
  local_20 = (value_type)0x0;
  std::vector<Event_*,_std::allocator<Event_*>_>::vector
            (&local_38,(long)this->numberOfOutputNeurons,&local_20,&local_39);
  ppEVar1 = (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar2 = (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (ppEVar1 != (pointer)0x0) {
    operator_delete(ppEVar1,(long)ppEVar2 - (long)ppEVar1);
    if (local_38.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  pCVar3 = Clock::getInstance();
  this->clock = pCVar3;
  pLVar4 = Logging::getInstance();
  this->logger = pLVar4;
  return;
}

Assistant:

void initialize() {
        output = std::vector<Event*>(numberOfOutputNeurons, NULL);
        clock = Clock::getInstance();
        logger = Logging::getInstance();
    }